

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O2

optional<unsigned_int> qt_get_hex_rgb(char *name)

{
  uint uVar1;
  size_t len;
  QRgba64 *this;
  _Optional_payload_base<unsigned_int> _Var2;
  long in_FS_OFFSET;
  optional<QRgba64> oVar3;
  _Storage<QRgba64,_true> local_20;
  undefined1 *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  len = qstrlen(name);
  oVar3 = get_hex_rgb(name,len);
  local_20 = oVar3.super__Optional_base<QRgba64,_true,_true>._M_payload.
             super__Optional_payload_base<QRgba64>._M_payload;
  local_18 = (undefined1 *)
             CONCAT71(local_18._1_7_,
                      oVar3.super__Optional_base<QRgba64,_true,_true>._M_payload.
                      super__Optional_payload_base<QRgba64>._M_engaged);
  if (((undefined1  [16])
       oVar3.super__Optional_base<QRgba64,_true,_true>._M_payload.
       super__Optional_payload_base<QRgba64> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    _Var2._M_payload = (_Storage<unsigned_int,_true>)0x0;
    _Var2._M_engaged = false;
    _Var2._5_3_ = 0;
  }
  else {
    this = std::_Optional_base_impl<QRgba64,_std::_Optional_base<QRgba64,_true,_true>_>::_M_get
                     ((_Optional_base_impl<QRgba64,_std::_Optional_base<QRgba64,_true,_true>_> *)
                      &local_20._M_value);
    uVar1 = QRgba64::toArgb32(this);
    _Var2 = (_Optional_payload_base<unsigned_int>)((ulong)uVar1 | 0x100000000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (optional<unsigned_int>)_Var2;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<QRgb> qt_get_hex_rgb(const char *name)
{
    if (std::optional<QRgba64> rgba64 = get_hex_rgb(name, qstrlen(name)))
        return rgba64->toArgb32();
    return std::nullopt;
}